

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint ON_SubDEdgeChain::OrientEdgesIntoEdgeChains
               (ON_SimpleArray<const_ON_SubDEdge_*> *edges,
               ON_SimpleArray<ON_SubDEdgePtr> *edge_chains)

{
  uint uVar1;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDEdgePtr *pOVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDEdge *pOVar5;
  int iVar6;
  ON_SubDEdgePtr *pOVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint i;
  ulong uVar16;
  
  uVar1 = edges->m_count;
  if (-1 < edge_chains->m_capacity) {
    edge_chains->m_count = 0;
  }
  ON_SimpleArray<ON_SubDEdgePtr>::Reserve(edge_chains,(ulong)uVar1);
  uVar16 = 0;
  pOVar2 = (ON_SubDEdgePtr *)0x0;
  iVar6 = 0;
  uVar10 = 0;
  do {
    if (uVar1 == uVar16) {
      return uVar10;
    }
    pOVar5 = edges->m_a[uVar16];
    if (((pOVar5 != (ON_SubDEdge *)0x0) && (pOVar5->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
       (pOVar5->m_vertex[0] != pOVar5->m_vertex[1] && pOVar5->m_vertex[1] != (ON_SubDVertex *)0x0))
    {
      pOVar3 = ON_SimpleArray<ON_SubDEdgePtr>::AppendNew(edge_chains);
      pOVar3->m_ptr = (ON__UINT_PTR)pOVar5;
      if (pOVar2 == (ON_SubDEdgePtr *)0x0) {
LAB_005f2d16:
        iVar6 = 0;
        uVar14 = 1;
      }
      else {
        pOVar4 = (ON_SubDEdge *)pOVar2->m_ptr;
        uVar11 = (ulong)pOVar4 & 0xfffffffffffffff8;
        if (uVar11 == 0) {
          lVar13 = 0;
        }
        else {
          lVar13 = *(long *)(uVar11 + 0x80 + (ulong)(~(uint)pOVar4 & 1) * 8);
        }
        uVar8 = (ulong)pOVar5 & 0xfffffffffffffff8;
        if (uVar8 == 0) {
          lVar12 = 0;
        }
        else {
          lVar12 = *(long *)(uVar8 + 0x80 + (ulong)((uint)pOVar5 & 1) * 8);
        }
        uVar14 = uVar10;
        if (lVar13 != lVar12) {
          if (uVar11 == 0) {
            lVar13 = 0;
            lVar12 = 0;
          }
          else {
            uVar14 = (uint)pOVar4 & 1;
            lVar13 = *(long *)(uVar11 + 0x80 + (ulong)uVar14 * 8);
            lVar12 = *(long *)(uVar11 + 0x80 + (ulong)(uVar14 ^ 1) * 8);
          }
          if (uVar8 == 0) {
            lVar15 = 0;
            lVar9 = 0;
          }
          else {
            uVar14 = (uint)pOVar5 & 1;
            lVar15 = *(long *)(uVar8 + 0x80 + (ulong)uVar14 * 8);
            lVar9 = *(long *)(uVar8 + 0x80 + (ulong)(uVar14 ^ 1) * 8);
          }
          pOVar7 = pOVar3;
          if (lVar12 != lVar9) {
            if (iVar6 != 1) goto LAB_005f2d16;
            if (lVar13 != lVar15) {
              iVar6 = 0;
              uVar14 = 1;
              if (lVar13 != lVar9) goto LAB_005f2d33;
              pOVar2->m_ptr = (ulong)pOVar4 & 0xfffffffffffffff9 ^ 1;
              pOVar4 = (ON_SubDEdge *)pOVar3->m_ptr;
              pOVar2 = pOVar3;
            }
            iVar6 = 1;
            pOVar5 = pOVar4;
            pOVar7 = pOVar2;
          }
          pOVar7->m_ptr = (ulong)pOVar5 & 0xfffffffffffffff9 ^ 1;
          uVar14 = uVar10;
        }
      }
LAB_005f2d33:
      uVar10 = uVar14;
      iVar6 = iVar6 + 1;
      pOVar2 = pOVar3;
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

unsigned int ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(
  const ON_SimpleArray< const ON_SubDEdge* >& edges,
  ON_SimpleArray< ON_SubDEdgePtr >& edge_chains
)
{
  const unsigned count = edges.UnsignedCount();
  edge_chains.SetCount(0);
  edge_chains.Reserve(count);
  unsigned int chain_count = 0;
  unsigned chain_length = 0;
  ON_SubDEdgePtr* prev_eptr = nullptr;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDEdge* e = edges[i];
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;
    ON_SubDEdgePtr& eptr = edge_chains.AppendNew();
    eptr = ON_SubDEdgePtr::Create(e);
    if (nullptr != prev_eptr && prev_eptr->RelativeVertex(1) != eptr.RelativeVertex(0) )
    {
      const ON_SubDVertex* prev_v[2] = { prev_eptr->RelativeVertex(0), prev_eptr->RelativeVertex(1) };
      const ON_SubDVertex* v[2] = { eptr.RelativeVertex(0), eptr.RelativeVertex(1) };
      if (prev_v[1] == v[1])
        eptr = eptr.Reversed();
      else if (1 == chain_length)
      {
        if (prev_v[0] == v[0])
          *prev_eptr = prev_eptr->Reversed();
        else if (prev_v[0] == v[1])
        {
          *prev_eptr = prev_eptr->Reversed();
          eptr = eptr.Reversed();
        }
        else
          prev_eptr = nullptr;
      }
      else
        prev_eptr = nullptr;
    }

    if (nullptr == prev_eptr)
    {
      chain_count = 1;
      chain_length = 0;
    }
    prev_eptr = &eptr;
    ++chain_length;
  }
  return chain_count;
}